

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode create_conn(Curl_easy *data,connectdata **in_connect,_Bool *async)

{
  _Bool _Var1;
  int iVar2;
  char *pcVar3;
  connectbundle *bundle_00;
  size_t sVar4;
  connectdata *pcVar5;
  char *local_98;
  char *local_90;
  connectdata *conn_candidate_1;
  connectdata *conn_candidate;
  connectbundle *bundle;
  size_t sStack_50;
  _Bool done;
  size_t max_total_connections;
  size_t max_host_connections;
  _Bool waitpipe;
  _Bool force_reuse;
  _Bool connections_available;
  connectdata *pcStack_38;
  _Bool reuse;
  connectdata *conn_temp;
  connectdata *conn;
  _Bool *p_Stack_20;
  CURLcode result;
  _Bool *async_local;
  connectdata **in_connect_local;
  Curl_easy *data_local;
  
  conn._4_4_ = 0;
  pcStack_38 = (connectdata *)0x0;
  max_host_connections._6_1_ = 1;
  max_host_connections._5_1_ = 0;
  max_host_connections._4_1_ = 0;
  p_Stack_20 = async;
  async_local = (_Bool *)in_connect;
  in_connect_local = (connectdata **)data;
  max_total_connections = Curl_multi_max_host_connections(data->multi);
  sStack_50 = Curl_multi_max_total_connections((Curl_multi *)in_connect_local[0x17]);
  *p_Stack_20 = false;
  async_local[0] = false;
  async_local[1] = false;
  async_local[2] = false;
  async_local[3] = false;
  async_local[4] = false;
  async_local[5] = false;
  async_local[6] = false;
  async_local[7] = false;
  if (in_connect_local[0x23d] == (connectdata *)0x0) {
    conn._4_4_ = CURLE_URL_MALFORMAT;
  }
  else {
    conn_temp = allocate_conn((Curl_easy *)in_connect_local);
    if (conn_temp == (connectdata *)0x0) {
      conn._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      *(connectdata **)async_local = conn_temp;
      conn._4_4_ = parseurlandfillconn((Curl_easy *)in_connect_local,conn_temp);
      if (conn._4_4_ == CURLE_OK) {
        if (in_connect_local[300] != (connectdata *)0x0) {
          pcVar3 = (*Curl_cstrdup)((char *)in_connect_local[300]);
          conn_temp->sasl_authzid = pcVar3;
          if (conn_temp->sasl_authzid == (char *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
        }
        if (in_connect_local[0x126] != (connectdata *)0x0) {
          pcVar3 = (*Curl_cstrdup)((char *)in_connect_local[0x126]);
          conn_temp->oauth_bearer = pcVar3;
          if (conn_temp->oauth_bearer == (char *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
        }
        conn._4_4_ = create_conn_helper_init_proxy((Curl_easy *)in_connect_local,conn_temp);
        if (conn._4_4_ == CURLE_OK) {
          if (((conn_temp->given->flags & 1) != 0) &&
             ((*(uint *)&(conn_temp->bits).field_0x4 & 1) != 0)) {
            *(uint *)&(conn_temp->bits).field_0x4 =
                 *(uint *)&(conn_temp->bits).field_0x4 & 0xfffffff7 | 8;
          }
          conn._4_4_ = parse_remote_port((Curl_easy *)in_connect_local,conn_temp);
          if ((((conn._4_4_ == CURLE_OK) &&
               (conn._4_4_ = override_login((Curl_easy *)in_connect_local,conn_temp),
               conn._4_4_ == CURLE_OK)) &&
              (conn._4_4_ = set_login((Curl_easy *)in_connect_local,conn_temp),
              conn._4_4_ == CURLE_OK)) &&
             (conn._4_4_ = parse_connect_to_slist
                                     ((Curl_easy *)in_connect_local,conn_temp,
                                      (curl_slist *)in_connect_local[0xa5]), conn._4_4_ == CURLE_OK)
             ) {
            if (((*(uint *)&(conn_temp->bits).field_0x4 >> 9 & 1) != 0) &&
               (iVar2 = Curl_strcasecompare((conn_temp->conn_to_host).name,(conn_temp->host).name),
               iVar2 != 0)) {
              *(uint *)&(conn_temp->bits).field_0x4 =
                   *(uint *)&(conn_temp->bits).field_0x4 & 0xfffffdff;
            }
            if (((*(uint *)&(conn_temp->bits).field_0x4 >> 10 & 1) != 0) &&
               (conn_temp->conn_to_port == conn_temp->remote_port)) {
              *(uint *)&(conn_temp->bits).field_0x4 =
                   *(uint *)&(conn_temp->bits).field_0x4 & 0xfffffbff;
            }
            if ((((*(uint *)&(conn_temp->bits).field_0x4 >> 9 & 1) != 0) ||
                ((*(uint *)&(conn_temp->bits).field_0x4 >> 10 & 1) != 0)) &&
               ((*(uint *)&(conn_temp->bits).field_0x4 & 1) != 0)) {
              *(uint *)&(conn_temp->bits).field_0x4 =
                   *(uint *)&(conn_temp->bits).field_0x4 & 0xfffffff7 | 8;
            }
            conn._4_4_ = setup_connection_internals((Curl_easy *)in_connect_local,conn_temp);
            if (conn._4_4_ == CURLE_OK) {
              conn_temp->recv[0] = Curl_recv_plain;
              conn_temp->send[0] = Curl_send_plain;
              conn_temp->recv[1] = Curl_recv_plain;
              conn_temp->send[1] = Curl_send_plain;
              *(uint *)&(conn_temp->bits).field_0x4 =
                   *(uint *)&(conn_temp->bits).field_0x4 & 0xfdffffff |
                   ((uint)((ulong)*(undefined8 *)((long)in_connect_local + 0xa92) >> 0x27) & 1) <<
                   0x19;
              if ((conn_temp->handler->flags & 0x10) == 0) {
                in_connect_local[0xaa] = in_connect_local[0x100];
                in_connect_local[0xab] = in_connect_local[0x102];
                in_connect_local[0xac] = in_connect_local[0x10d];
                in_connect_local[0xb4] = in_connect_local[0x139];
                in_connect_local[0xae] = in_connect_local[0x106];
                in_connect_local[0xaf] = in_connect_local[0x108];
                in_connect_local[0xb0] = in_connect_local[0x104];
                in_connect_local[0xb2] = in_connect_local[0x135];
                in_connect_local[0xb3] = in_connect_local[0x13b];
                in_connect_local[0xb5] = in_connect_local[0x131];
                in_connect_local[0xc2] = in_connect_local[0x101];
                in_connect_local[0xc3] = in_connect_local[0x103];
                in_connect_local[0xc6] = in_connect_local[0x107];
                in_connect_local[199] = in_connect_local[0x109];
                in_connect_local[200] = in_connect_local[0x105];
                in_connect_local[0xca] = in_connect_local[0x136];
                in_connect_local[0xcb] = in_connect_local[0x13c];
                in_connect_local[0xc4] = in_connect_local[0x10e];
                in_connect_local[0xcc] = in_connect_local[0x13a];
                in_connect_local[0xc9] = in_connect_local[0x10c];
                in_connect_local[0xd2] = in_connect_local[0xe9];
                in_connect_local[0xd3] = in_connect_local[0xf4];
                in_connect_local[0xd5] = in_connect_local[0xf8];
                in_connect_local[0xd6] = in_connect_local[0xf6];
                in_connect_local[0xc5] = in_connect_local[0xe7];
                in_connect_local[0xd4] = in_connect_local[0x138];
                in_connect_local[0xb1] = in_connect_local[0x10b];
                in_connect_local[0xba] = in_connect_local[0xe8];
                in_connect_local[0xbb] = in_connect_local[0xf3];
                in_connect_local[0xbd] = in_connect_local[0xf7];
                in_connect_local[0xbe] = in_connect_local[0xf5];
                in_connect_local[0xad] = in_connect_local[0xe6];
                in_connect_local[0xbc] = in_connect_local[0x137];
                _Var1 = Curl_clone_primary_ssl_config
                                  ((ssl_primary_config *)(in_connect_local + 0xa8),
                                   &conn_temp->ssl_config);
                if (_Var1) {
                  _Var1 = Curl_clone_primary_ssl_config
                                    ((ssl_primary_config *)(in_connect_local + 0xc0),
                                     &conn_temp->proxy_ssl_config);
                  if (_Var1) {
                    prune_dead_connections((Curl_easy *)in_connect_local);
                    if ((((*(ulong *)((long)in_connect_local + 0xa92) >> 0x1e & 1) == 0) ||
                        ((*(uint *)(in_connect_local + 0x260) >> 1 & 1) != 0)) &&
                       (*(char *)((long)in_connect_local + 0xa91) == '\0')) {
                      max_host_connections._7_1_ =
                           ConnectionExists((Curl_easy *)in_connect_local,conn_temp,
                                            &stack0xffffffffffffffc8,
                                            (_Bool *)((long)&max_host_connections + 5),
                                            (_Bool *)((long)&max_host_connections + 4));
                    }
                    else {
                      max_host_connections._7_1_ = false;
                    }
                    if ((_Bool)max_host_connections._7_1_ == false) {
                      if (((conn_temp->handler->flags & 0x100) != 0) &&
                         ((*(ulong *)((long)in_connect_local + 0xa92) >> 0x28 & 1) != 0)) {
                        *(uint *)&(conn_temp->bits).field_0x4 =
                             *(uint *)&(conn_temp->bits).field_0x4 & 0xfbffffff | 0x4000000;
                      }
                      if ((max_host_connections._4_1_ & 1) == 0) {
                        bundle_00 = Curl_conncache_find_bundle
                                              ((Curl_easy *)in_connect_local,conn_temp,
                                               (conncache *)in_connect_local[0x186]);
                        if (((max_total_connections == 0) || (bundle_00 == (connectbundle *)0x0)) ||
                           (bundle_00->num_connections < max_total_connections)) {
                          if (in_connect_local[0x19] != (connectdata *)0x0) {
                            Curl_share_unlock((Curl_easy *)in_connect_local,CURL_LOCK_DATA_CONNECT);
                          }
                        }
                        else {
                          pcVar5 = Curl_conncache_extract_bundle
                                             ((Curl_easy *)in_connect_local,bundle_00);
                          if (in_connect_local[0x19] != (connectdata *)0x0) {
                            Curl_share_unlock((Curl_easy *)in_connect_local,CURL_LOCK_DATA_CONNECT);
                          }
                          if (pcVar5 == (connectdata *)0x0) {
                            Curl_infof((Curl_easy *)in_connect_local,
                                       "No more connections allowed to host: %zu",
                                       max_total_connections);
                            max_host_connections._6_1_ = 0;
                          }
                          else {
                            Curl_disconnect((Curl_easy *)in_connect_local,pcVar5,false);
                          }
                        }
                      }
                      else {
                        max_host_connections._6_1_ = 0;
                      }
                      if ((((max_host_connections._6_1_ & 1) != 0) && (sStack_50 != 0)) &&
                         (sVar4 = Curl_conncache_size((Curl_easy *)in_connect_local),
                         sStack_50 <= sVar4)) {
                        pcVar5 = Curl_conncache_extract_oldest((Curl_easy *)in_connect_local);
                        if (pcVar5 == (connectdata *)0x0) {
                          Curl_infof((Curl_easy *)in_connect_local,
                                     "No connections available in cache");
                          max_host_connections._6_1_ = 0;
                        }
                        else {
                          Curl_disconnect((Curl_easy *)in_connect_local,pcVar5,false);
                        }
                      }
                      if ((max_host_connections._6_1_ & 1) == 0) {
                        Curl_infof((Curl_easy *)in_connect_local,"No connections available.");
                        conn_free(conn_temp);
                        async_local[0] = false;
                        async_local[1] = false;
                        async_local[2] = false;
                        async_local[3] = false;
                        async_local[4] = false;
                        async_local[5] = false;
                        async_local[6] = false;
                        async_local[7] = false;
                        return CURLE_NO_CONNECTION_AVAILABLE;
                      }
                      Curl_attach_connection((Curl_easy *)in_connect_local,conn_temp);
                      conn._4_4_ = Curl_conncache_add_conn((Curl_easy *)in_connect_local);
                      if (conn._4_4_ != CURLE_OK) {
                        return conn._4_4_;
                      }
                      if ((((ulong)in_connect_local[0x1b9] & 0x28) != 0) &&
                         (((ulong)in_connect_local[0x1bb] & 1) != 0)) {
                        Curl_infof((Curl_easy *)in_connect_local,
                                   "NTLM picked AND auth done set, clear picked");
                        in_connect_local[0x1b9] = (connectdata *)0x0;
                        *(byte *)(in_connect_local + 0x1bb) =
                             *(byte *)(in_connect_local + 0x1bb) & 0xfe;
                      }
                      if ((((ulong)in_connect_local[0x1bd] & 0x28) != 0) &&
                         (((ulong)in_connect_local[0x1bf] & 1) != 0)) {
                        Curl_infof((Curl_easy *)in_connect_local,
                                   "NTLM-proxy picked AND auth done set, clear picked");
                        in_connect_local[0x1bd] = (connectdata *)0x0;
                        *(byte *)(in_connect_local + 0x1bf) =
                             *(byte *)(in_connect_local + 0x1bf) & 0xfe;
                      }
                    }
                    else {
                      reuse_conn((Curl_easy *)in_connect_local,conn_temp,pcStack_38);
                      conn_temp = pcStack_38;
                      *(connectdata **)async_local = pcStack_38;
                      pcVar3 = "host";
                      if ((*(uint *)&(pcStack_38->bits).field_0x4 >> 5 & 1) != 0) {
                        pcVar3 = "proxy";
                      }
                      if ((pcStack_38->socks_proxy).host.name == (char *)0x0) {
                        if ((pcStack_38->http_proxy).host.name == (char *)0x0) {
                          local_98 = (pcStack_38->host).dispname;
                        }
                        else {
                          local_98 = (pcStack_38->http_proxy).host.dispname;
                        }
                        local_90 = local_98;
                      }
                      else {
                        local_90 = (pcStack_38->socks_proxy).host.dispname;
                      }
                      Curl_infof((Curl_easy *)in_connect_local,
                                 "Re-using existing connection #%ld with %s %s",
                                 pcStack_38->connection_id,pcVar3,local_90);
                    }
                    Curl_init_do((Curl_easy *)in_connect_local,conn_temp);
                    conn._4_4_ = setup_range((Curl_easy *)in_connect_local);
                    if (conn._4_4_ == CURLE_OK) {
                      conn_temp->seek_func = (curl_seek_callback)in_connect_local[0x43];
                      conn_temp->seek_client = in_connect_local[0x56];
                      conn._4_4_ = resolve_server((Curl_easy *)in_connect_local,conn_temp,p_Stack_20
                                                 );
                    }
                  }
                  else {
                    conn._4_4_ = CURLE_OUT_OF_MEMORY;
                  }
                }
                else {
                  conn._4_4_ = CURLE_OUT_OF_MEMORY;
                }
              }
              else {
                Curl_persistconninfo((Curl_easy *)in_connect_local,conn_temp,(char *)0x0,-1);
                conn._4_4_ = (*conn_temp->handler->connect_it)
                                       ((Curl_easy *)in_connect_local,(_Bool *)((long)&bundle + 7));
                if (conn._4_4_ == CURLE_OK) {
                  (conn_temp->bits).tcpconnect[0] = true;
                  Curl_attach_connection((Curl_easy *)in_connect_local,conn_temp);
                  conn._4_4_ = Curl_conncache_add_conn((Curl_easy *)in_connect_local);
                  if (conn._4_4_ != CURLE_OK) {
                    return conn._4_4_;
                  }
                  conn._4_4_ = setup_range((Curl_easy *)in_connect_local);
                  if (conn._4_4_ != CURLE_OK) {
                    (*conn_temp->handler->done)((Curl_easy *)in_connect_local,conn._4_4_,false);
                    return conn._4_4_;
                  }
                  Curl_setup_transfer((Curl_easy *)in_connect_local,-1,-1,false,-1);
                }
                Curl_init_do((Curl_easy *)in_connect_local,conn_temp);
              }
            }
          }
        }
      }
    }
  }
  return conn._4_4_;
}

Assistant:

static CURLcode create_conn(struct Curl_easy *data,
                            struct connectdata **in_connect,
                            bool *async)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn;
  struct connectdata *conn_temp = NULL;
  bool reuse;
  bool connections_available = TRUE;
  bool force_reuse = FALSE;
  bool waitpipe = FALSE;
  size_t max_host_connections = Curl_multi_max_host_connections(data->multi);
  size_t max_total_connections = Curl_multi_max_total_connections(data->multi);

  *async = FALSE;
  *in_connect = NULL;

  /*************************************************************
   * Check input data
   *************************************************************/
  if(!data->state.url) {
    result = CURLE_URL_MALFORMAT;
    goto out;
  }

  /* First, split up the current URL in parts so that we can use the
     parts for checking against the already present connections. In order
     to not have to modify everything at once, we allocate a temporary
     connection data struct and fill in for comparison purposes. */
  conn = allocate_conn(data);

  if(!conn) {
    result = CURLE_OUT_OF_MEMORY;
    goto out;
  }

  /* We must set the return variable as soon as possible, so that our
     parent can cleanup any possible allocs we may have done before
     any failure */
  *in_connect = conn;

  result = parseurlandfillconn(data, conn);
  if(result)
    goto out;

  if(data->set.str[STRING_SASL_AUTHZID]) {
    conn->sasl_authzid = strdup(data->set.str[STRING_SASL_AUTHZID]);
    if(!conn->sasl_authzid) {
      result = CURLE_OUT_OF_MEMORY;
      goto out;
    }
  }

  if(data->set.str[STRING_BEARER]) {
    conn->oauth_bearer = strdup(data->set.str[STRING_BEARER]);
    if(!conn->oauth_bearer) {
      result = CURLE_OUT_OF_MEMORY;
      goto out;
    }
  }

#ifdef USE_UNIX_SOCKETS
  if(data->set.str[STRING_UNIX_SOCKET_PATH]) {
    conn->unix_domain_socket = strdup(data->set.str[STRING_UNIX_SOCKET_PATH]);
    if(!conn->unix_domain_socket) {
      result = CURLE_OUT_OF_MEMORY;
      goto out;
    }
    conn->bits.abstract_unix_socket = data->set.abstract_unix_socket;
  }
#endif

  /* After the unix socket init but before the proxy vars are used, parse and
     initialize the proxy vars */
#ifndef CURL_DISABLE_PROXY
  result = create_conn_helper_init_proxy(data, conn);
  if(result)
    goto out;

  /*************************************************************
   * If the protocol is using SSL and HTTP proxy is used, we set
   * the tunnel_proxy bit.
   *************************************************************/
  if((conn->given->flags&PROTOPT_SSL) && conn->bits.httpproxy)
    conn->bits.tunnel_proxy = TRUE;
#endif

  /*************************************************************
   * Figure out the remote port number and fix it in the URL
   *************************************************************/
  result = parse_remote_port(data, conn);
  if(result)
    goto out;

  /* Check for overridden login details and set them accordingly so that
     they are known when protocol->setup_connection is called! */
  result = override_login(data, conn);
  if(result)
    goto out;

  result = set_login(data, conn); /* default credentials */
  if(result)
    goto out;

  /*************************************************************
   * Process the "connect to" linked list of hostname/port mappings.
   * Do this after the remote port number has been fixed in the URL.
   *************************************************************/
  result = parse_connect_to_slist(data, conn, data->set.connect_to);
  if(result)
    goto out;


  /*************************************************************
   * Check whether the host and the "connect to host" are equal.
   * Do this after the hostnames have been IDN-converted.
   *************************************************************/
  if(conn->bits.conn_to_host &&
     strcasecompare(conn->conn_to_host.name, conn->host.name)) {
    conn->bits.conn_to_host = FALSE;
  }

  /*************************************************************
   * Check whether the port and the "connect to port" are equal.
   * Do this after the remote port number has been fixed in the URL.
   *************************************************************/
  if(conn->bits.conn_to_port && conn->conn_to_port == conn->remote_port) {
    conn->bits.conn_to_port = FALSE;
  }

#ifndef CURL_DISABLE_PROXY
  /*************************************************************
   * If the "connect to" feature is used with an HTTP proxy,
   * we set the tunnel_proxy bit.
   *************************************************************/
  if((conn->bits.conn_to_host || conn->bits.conn_to_port) &&
      conn->bits.httpproxy)
    conn->bits.tunnel_proxy = TRUE;
#endif

  /*************************************************************
   * Setup internals depending on protocol. Needs to be done after
   * we figured out what/if proxy to use.
   *************************************************************/
  result = setup_connection_internals(data, conn);
  if(result)
    goto out;

  conn->recv[FIRSTSOCKET] = Curl_recv_plain;
  conn->send[FIRSTSOCKET] = Curl_send_plain;
  conn->recv[SECONDARYSOCKET] = Curl_recv_plain;
  conn->send[SECONDARYSOCKET] = Curl_send_plain;

  conn->bits.tcp_fastopen = data->set.tcp_fastopen;

  /***********************************************************************
   * file: is a special case in that it doesn't need a network connection
   ***********************************************************************/
#ifndef CURL_DISABLE_FILE
  if(conn->handler->flags & PROTOPT_NONETWORK) {
    bool done;
    /* this is supposed to be the connect function so we better at least check
       that the file is present here! */
    DEBUGASSERT(conn->handler->connect_it);
    Curl_persistconninfo(data, conn, NULL, -1);
    result = conn->handler->connect_it(data, &done);

    /* Setup a "faked" transfer that'll do nothing */
    if(!result) {
      conn->bits.tcpconnect[FIRSTSOCKET] = TRUE; /* we are "connected */

      Curl_attach_connection(data, conn);
      result = Curl_conncache_add_conn(data);
      if(result)
        goto out;

      /*
       * Setup whatever necessary for a resumed transfer
       */
      result = setup_range(data);
      if(result) {
        DEBUGASSERT(conn->handler->done);
        /* we ignore the return code for the protocol-specific DONE */
        (void)conn->handler->done(data, result, FALSE);
        goto out;
      }
      Curl_setup_transfer(data, -1, -1, FALSE, -1);
    }

    /* since we skip do_init() */
    Curl_init_do(data, conn);

    goto out;
  }
#endif

  /* Get a cloned copy of the SSL config situation stored in the
     connection struct. But to get this going nicely, we must first make
     sure that the strings in the master copy are pointing to the correct
     strings in the session handle strings array!

     Keep in mind that the pointers in the master copy are pointing to strings
     that will be freed as part of the Curl_easy struct, but all cloned
     copies will be separately allocated.
  */
  data->set.ssl.primary.CApath = data->set.str[STRING_SSL_CAPATH];
  data->set.ssl.primary.CAfile = data->set.str[STRING_SSL_CAFILE];
  data->set.ssl.primary.issuercert = data->set.str[STRING_SSL_ISSUERCERT];
  data->set.ssl.primary.issuercert_blob = data->set.blobs[BLOB_SSL_ISSUERCERT];
  data->set.ssl.primary.cipher_list =
    data->set.str[STRING_SSL_CIPHER_LIST];
  data->set.ssl.primary.cipher_list13 =
    data->set.str[STRING_SSL_CIPHER13_LIST];
  data->set.ssl.primary.pinned_key =
    data->set.str[STRING_SSL_PINNEDPUBLICKEY];
  data->set.ssl.primary.cert_blob = data->set.blobs[BLOB_CERT];
  data->set.ssl.primary.ca_info_blob = data->set.blobs[BLOB_CAINFO];
  data->set.ssl.primary.curves = data->set.str[STRING_SSL_EC_CURVES];

#ifndef CURL_DISABLE_PROXY
  data->set.proxy_ssl.primary.CApath = data->set.str[STRING_SSL_CAPATH_PROXY];
  data->set.proxy_ssl.primary.CAfile = data->set.str[STRING_SSL_CAFILE_PROXY];
  data->set.proxy_ssl.primary.cipher_list =
    data->set.str[STRING_SSL_CIPHER_LIST_PROXY];
  data->set.proxy_ssl.primary.cipher_list13 =
    data->set.str[STRING_SSL_CIPHER13_LIST_PROXY];
  data->set.proxy_ssl.primary.pinned_key =
    data->set.str[STRING_SSL_PINNEDPUBLICKEY_PROXY];
  data->set.proxy_ssl.primary.cert_blob = data->set.blobs[BLOB_CERT_PROXY];
  data->set.proxy_ssl.primary.ca_info_blob =
    data->set.blobs[BLOB_CAINFO_PROXY];
  data->set.proxy_ssl.primary.issuercert =
    data->set.str[STRING_SSL_ISSUERCERT_PROXY];
  data->set.proxy_ssl.primary.issuercert_blob =
    data->set.blobs[BLOB_SSL_ISSUERCERT_PROXY];
  data->set.proxy_ssl.primary.CRLfile =
    data->set.str[STRING_SSL_CRLFILE_PROXY];
  data->set.proxy_ssl.cert_type = data->set.str[STRING_CERT_TYPE_PROXY];
  data->set.proxy_ssl.key = data->set.str[STRING_KEY_PROXY];
  data->set.proxy_ssl.key_type = data->set.str[STRING_KEY_TYPE_PROXY];
  data->set.proxy_ssl.key_passwd = data->set.str[STRING_KEY_PASSWD_PROXY];
  data->set.proxy_ssl.primary.clientcert = data->set.str[STRING_CERT_PROXY];
  data->set.proxy_ssl.key_blob = data->set.blobs[BLOB_KEY_PROXY];
#endif
  data->set.ssl.primary.CRLfile = data->set.str[STRING_SSL_CRLFILE];
  data->set.ssl.cert_type = data->set.str[STRING_CERT_TYPE];
  data->set.ssl.key = data->set.str[STRING_KEY];
  data->set.ssl.key_type = data->set.str[STRING_KEY_TYPE];
  data->set.ssl.key_passwd = data->set.str[STRING_KEY_PASSWD];
  data->set.ssl.primary.clientcert = data->set.str[STRING_CERT];
#ifdef USE_TLS_SRP
  data->set.ssl.primary.username = data->set.str[STRING_TLSAUTH_USERNAME];
  data->set.ssl.primary.password = data->set.str[STRING_TLSAUTH_PASSWORD];
#ifndef CURL_DISABLE_PROXY
  data->set.proxy_ssl.primary.username =
    data->set.str[STRING_TLSAUTH_USERNAME_PROXY];
  data->set.proxy_ssl.primary.password =
    data->set.str[STRING_TLSAUTH_PASSWORD_PROXY];
#endif
#endif
  data->set.ssl.key_blob = data->set.blobs[BLOB_KEY];

  if(!Curl_clone_primary_ssl_config(&data->set.ssl.primary,
                                    &conn->ssl_config)) {
    result = CURLE_OUT_OF_MEMORY;
    goto out;
  }

#ifndef CURL_DISABLE_PROXY
  if(!Curl_clone_primary_ssl_config(&data->set.proxy_ssl.primary,
                                    &conn->proxy_ssl_config)) {
    result = CURLE_OUT_OF_MEMORY;
    goto out;
  }
#endif

  prune_dead_connections(data);

  /*************************************************************
   * Check the current list of connections to see if we can
   * re-use an already existing one or if we have to create a
   * new one.
   *************************************************************/

  DEBUGASSERT(conn->user);
  DEBUGASSERT(conn->passwd);

  /* reuse_fresh is TRUE if we are told to use a new connection by force, but
     we only acknowledge this option if this is not a re-used connection
     already (which happens due to follow-location or during a HTTP
     authentication phase). CONNECT_ONLY transfers also refuse reuse. */
  if((data->set.reuse_fresh && !data->state.this_is_a_follow) ||
     data->set.connect_only)
    reuse = FALSE;
  else
    reuse = ConnectionExists(data, conn, &conn_temp, &force_reuse, &waitpipe);

  if(reuse) {
    /*
     * We already have a connection for this, we got the former connection in
     * the conn_temp variable and thus we need to cleanup the one we just
     * allocated before we can move along and use the previously existing one.
     */
    reuse_conn(data, conn, conn_temp);
    conn = conn_temp;
    *in_connect = conn;

#ifndef CURL_DISABLE_PROXY
    infof(data, "Re-using existing connection #%ld with %s %s",
          conn->connection_id,
          conn->bits.proxy?"proxy":"host",
          conn->socks_proxy.host.name ? conn->socks_proxy.host.dispname :
          conn->http_proxy.host.name ? conn->http_proxy.host.dispname :
          conn->host.dispname);
#else
    infof(data, "Re-using existing connection #%ld with host %s",
          conn->connection_id, conn->host.dispname);
#endif
  }
  else {
    /* We have decided that we want a new connection. However, we may not
       be able to do that if we have reached the limit of how many
       connections we are allowed to open. */

    if(conn->handler->flags & PROTOPT_ALPN) {
      /* The protocol wants it, so set the bits if enabled in the easy handle
         (default) */
      if(data->set.ssl_enable_alpn)
        conn->bits.tls_enable_alpn = TRUE;
    }

    if(waitpipe)
      /* There is a connection that *might* become usable for multiplexing
         "soon", and we wait for that */
      connections_available = FALSE;
    else {
      /* this gets a lock on the conncache */
      struct connectbundle *bundle =
        Curl_conncache_find_bundle(data, conn, data->state.conn_cache);

      if(max_host_connections > 0 && bundle &&
         (bundle->num_connections >= max_host_connections)) {
        struct connectdata *conn_candidate;

        /* The bundle is full. Extract the oldest connection. */
        conn_candidate = Curl_conncache_extract_bundle(data, bundle);
        CONNCACHE_UNLOCK(data);

        if(conn_candidate)
          Curl_disconnect(data, conn_candidate, FALSE);
        else {
          infof(data, "No more connections allowed to host: %zu",
                max_host_connections);
          connections_available = FALSE;
        }
      }
      else
        CONNCACHE_UNLOCK(data);

    }

    if(connections_available &&
       (max_total_connections > 0) &&
       (Curl_conncache_size(data) >= max_total_connections)) {
      struct connectdata *conn_candidate;

      /* The cache is full. Let's see if we can kill a connection. */
      conn_candidate = Curl_conncache_extract_oldest(data);
      if(conn_candidate)
        Curl_disconnect(data, conn_candidate, FALSE);
      else {
        infof(data, "No connections available in cache");
        connections_available = FALSE;
      }
    }

    if(!connections_available) {
      infof(data, "No connections available.");

      conn_free(conn);
      *in_connect = NULL;

      result = CURLE_NO_CONNECTION_AVAILABLE;
      goto out;
    }
    else {
      /*
       * This is a brand new connection, so let's store it in the connection
       * cache of ours!
       */
      Curl_attach_connection(data, conn);
      result = Curl_conncache_add_conn(data);
      if(result)
        goto out;
    }

#if defined(USE_NTLM)
    /* If NTLM is requested in a part of this connection, make sure we don't
       assume the state is fine as this is a fresh connection and NTLM is
       connection based. */
    if((data->state.authhost.picked & (CURLAUTH_NTLM | CURLAUTH_NTLM_WB)) &&
       data->state.authhost.done) {
      infof(data, "NTLM picked AND auth done set, clear picked");
      data->state.authhost.picked = CURLAUTH_NONE;
      data->state.authhost.done = FALSE;
    }

    if((data->state.authproxy.picked & (CURLAUTH_NTLM | CURLAUTH_NTLM_WB)) &&
       data->state.authproxy.done) {
      infof(data, "NTLM-proxy picked AND auth done set, clear picked");
      data->state.authproxy.picked = CURLAUTH_NONE;
      data->state.authproxy.done = FALSE;
    }
#endif
  }

  /* Setup and init stuff before DO starts, in preparing for the transfer. */
  Curl_init_do(data, conn);

  /*
   * Setup whatever necessary for a resumed transfer
   */
  result = setup_range(data);
  if(result)
    goto out;

  /* Continue connectdata initialization here. */

  /*
   * Inherit the proper values from the urldata struct AFTER we have arranged
   * the persistent connection stuff
   */
  conn->seek_func = data->set.seek_func;
  conn->seek_client = data->set.seek_client;

  /*************************************************************
   * Resolve the address of the server or proxy
   *************************************************************/
  result = resolve_server(data, conn, async);

out:
  return result;
}